

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseAssembler::embed(BaseAssembler *this,void *data,size_t dataSize)

{
  long in_RDX;
  BaseAssembler *in_RDI;
  StringTmp<512UL> sb;
  Error _err;
  CodeWriter writer;
  StringTmp<512UL> *this_00;
  char *in_stack_fffffffffffffcf0;
  String *in_stack_fffffffffffffcf8;
  BaseAssembler *in_stack_fffffffffffffd00;
  CodeWriter *in_stack_fffffffffffffd08;
  BaseAssembler *in_stack_fffffffffffffd10;
  StringTmp<512UL> *this_01;
  String *in_stack_fffffffffffffd18;
  StringTmp<512UL> local_2d0;
  undefined1 auStack_2cf [7];
  ulong local_2c8;
  undefined1 *local_2b8;
  size_t in_stack_fffffffffffffd80;
  CodeWriter local_a0 [4];
  Error local_7c;
  StringTmp<512UL> *local_78;
  Logger *local_70;
  undefined1 local_59;
  StringTmp<512UL> *local_58;
  StringTmp<512UL> *local_50;
  Logger *local_48;
  FormatOptions *local_40;
  Environment *local_30;
  StringTmp<512UL> *local_28;
  StringTmp<512UL> *local_20;
  StringTmp<512UL> *local_18;
  StringTmp<512UL> *local_10;
  StringTmp<512UL> *local_8;
  
  if ((in_RDI->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    DebugUtils::errored(5);
    local_7c = BaseEmitter::reportError
                         (&in_stack_fffffffffffffd00->super_BaseEmitter,
                          (Error)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                          in_stack_fffffffffffffcf0);
  }
  else if (in_RDX == 0) {
    local_7c = 0;
  }
  else {
    CodeWriter::CodeWriter(local_a0,in_RDI);
    local_7c = CodeWriter::ensureSpace
                         ((CodeWriter *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                          (size_t)in_stack_fffffffffffffd08);
    if (local_7c == 0) {
      CodeWriter::emitData
                ((CodeWriter *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                 (size_t)in_stack_fffffffffffffcf0);
      CodeWriter::done(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      if ((in_RDI->super_BaseEmitter)._logger != (Logger *)0x0) {
        this_01 = &local_2d0;
        local_78 = this_01;
        local_8 = this_01;
        memset(this_01,0,0x20);
        StringTmp<512UL>::_resetToTemporary(this_01);
        local_70 = (in_RDI->super_BaseEmitter)._logger;
        local_40 = &local_70->_options;
        local_30 = &(in_RDI->super_BaseEmitter)._environment;
        this_00 = (StringTmp<512UL> *)0x1;
        Formatter::formatData
                  (in_stack_fffffffffffffd18,(FormatFlags)((ulong)this_01 >> 0x20),
                   (Arch)((ulong)this_01 >> 0x18),(TypeId)((ulong)this_01 >> 0x10),
                   in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00,
                   in_stack_fffffffffffffd80);
        local_58 = &local_2d0;
        local_59 = 10;
        String::_opChar(in_stack_fffffffffffffcf8,
                        (ModifyOp)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                        (char)((ulong)in_stack_fffffffffffffcf0 >> 0x18));
        local_48 = (in_RDI->super_BaseEmitter)._logger;
        local_50 = &local_2d0;
        if ((byte)local_2d0 < 0x1f) {
          local_2b8 = auStack_2cf;
          local_2c8 = (ulong)(byte)local_2d0;
        }
        local_28 = local_50;
        local_20 = local_50;
        local_18 = local_50;
        local_10 = local_50;
        (*local_48->_vptr_Logger[2])(local_48,local_2b8,local_2c8);
        StringTmp<512UL>::~StringTmp(this_00);
      }
      local_7c = 0;
    }
  }
  return local_7c;
}

Assistant:

Error BaseAssembler::embed(const void* data, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (dataSize == 0)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

  writer.emitData(data, dataSize);
  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<512> sb;
    Formatter::formatData(sb, _logger->flags(), arch(), TypeId::kUInt8, data, dataSize, 1);
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}